

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

void dictionary_text_close(dictionary_t t_dictionary)

{
  void *__ptr;
  long lVar1;
  long *__ptr_00;
  ulong uVar2;
  
  if (*t_dictionary != 0) {
    uVar2 = 0;
    do {
      lVar1 = uVar2 * 0x10;
      free(*(void **)(*(long *)((long)t_dictionary + 0x10) + lVar1));
      __ptr_00 = *(long **)(*(long *)((long)t_dictionary + 0x10) + 8 + lVar1);
      __ptr = (void *)*__ptr_00;
      if (__ptr != (void *)0x0) {
        do {
          __ptr_00 = __ptr_00 + 1;
          free(__ptr);
          __ptr = (void *)*__ptr_00;
        } while (__ptr != (void *)0x0);
        __ptr_00 = *(long **)(*(long *)((long)t_dictionary + 0x10) + 8 + lVar1);
      }
      free(__ptr_00);
      uVar2 = uVar2 + 1;
    } while (uVar2 < *t_dictionary);
  }
  free(*(void **)((long)t_dictionary + 0x10));
  free(*(void **)((long)t_dictionary + 0x18));
  free(t_dictionary);
  return;
}

Assistant:

void dictionary_text_close(dictionary_t t_dictionary)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; ++ i)
	{
		free(text_dictionary->lexicon[i].key);

		ucs4_t ** j;
		for (j = text_dictionary->lexicon[i].value; *j; ++ j)
		{
			free(*j);
		}
		free(text_dictionary->lexicon[i].value);
	}

	free(text_dictionary->lexicon);
	free(text_dictionary->word_buff);
	free(text_dictionary);
}